

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O2

void clear_all_flags(void)

{
  byte bVar1;
  dungeon_map *pdVar2;
  uint8_t (*pauVar3) [30];
  uint8_t (*pauVar4) [30];
  size_t y;
  ulong uVar5;
  uint8_t (*pauVar6) [30];
  ulong uVar7;
  
  pauVar3 = maps->tiles;
  for (pdVar2 = maps; pdVar2->index != '\0'; pdVar2 = pdVar2 + 1) {
    bVar1 = pdVar2->height;
    pauVar4 = pauVar3;
    for (uVar5 = 0; uVar5 != bVar1; uVar5 = uVar5 + 1) {
      pauVar6 = pauVar4;
      for (uVar7 = 0; uVar7 < pdVar2->width; uVar7 = uVar7 + 1) {
        (*pauVar6)[0] = (*pauVar6)[0] & 7;
        pauVar6 = pauVar6 + 1;
      }
      pauVar4 = (uint8_t (*) [30])(*pauVar4 + 1);
    }
    pauVar3 = (uint8_t (*) [30])((long)(pauVar3 + 0x1e) + 3);
  }
  return;
}

Assistant:

static void clear_all_flags()
{
    dungeon_map *map;
    for (map = maps; map->index; map++) {
        clear_flags(map);
    }
}